

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O2

boolean decode_mcu_AC_first(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  jpeg_entropy_decoder *pjVar1;
  JBLOCKROW paJVar2;
  jpeg_error_mgr *pjVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  uchar *st;
  
  pjVar1 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    iVar7 = *(int *)((long)&pjVar1[3].start_pass + 4);
    if (iVar7 == 0) {
      process_restart(cinfo);
      iVar7 = *(int *)((long)&pjVar1[3].start_pass + 4);
    }
    *(int *)((long)&pjVar1[3].start_pass + 4) = iVar7 + -1;
  }
  if (pjVar1[1].insufficient_data != -1) {
    paJVar2 = *MCU_data;
    lVar10 = (long)cinfo->cur_comp_info[0]->ac_tbl_no;
    for (iVar7 = cinfo->Ss; iVar7 <= cinfo->Se; iVar7 = iVar7 + (int)lVar8 + 1) {
      lVar8 = *(long *)(&pjVar1[8].insufficient_data + lVar10 * 2);
      lVar12 = (long)(iVar7 * 3 + -3);
      iVar4 = arith_decode(cinfo,(uchar *)(lVar8 + lVar12));
      if (iVar4 != 0) {
        return 1;
      }
      st = (uchar *)(lVar12 + lVar8 + 2);
      lVar8 = 0;
      while (iVar4 = arith_decode(cinfo,st + -1), iVar4 == 0) {
        st = st + 3;
        lVar8 = lVar8 + 1;
        if (cinfo->Se <= iVar7 + -1 + (int)lVar8) goto LAB_00131cae;
      }
      iVar4 = arith_decode(cinfo,(uchar *)(pjVar1 + 0xe));
      iVar5 = arith_decode(cinfo,st);
      if (iVar5 == 0) {
        uVar9 = 0;
      }
      else {
        iVar5 = arith_decode(cinfo,st);
        uVar9 = 1;
        if (iVar5 != 0) {
          lVar12 = 0xbd;
          if ((int)(uint)cinfo->arith_ac_K[lVar10] < iVar7 + (int)lVar8) {
            lVar12 = 0xd9;
          }
          st = (uchar *)(lVar12 + *(long *)(&pjVar1[8].insufficient_data + lVar10 * 2));
          uVar9 = 2;
          while (iVar5 = arith_decode(cinfo,st), iVar5 != 0) {
            uVar9 = uVar9 * 2;
            if (uVar9 == 0x8000) {
LAB_00131cae:
              pjVar3 = cinfo->err;
              pjVar3->msg_code = 0x7e;
              (*pjVar3->emit_message)((j_common_ptr)cinfo,-1);
              pjVar1[1].insufficient_data = -1;
              return 1;
            }
            st = st + 1;
          }
        }
      }
      uVar11 = uVar9;
      while (1 < uVar11) {
        uVar11 = (int)uVar11 >> 1;
        uVar6 = arith_decode(cinfo,st + 0xe);
        if (uVar6 != 0) {
          uVar6 = uVar11;
        }
        uVar9 = uVar9 | uVar6;
      }
      uVar11 = ~uVar9;
      if (iVar4 == 0) {
        uVar11 = uVar9 + 1;
      }
      (*paJVar2)[jpeg_natural_order[iVar7 + lVar8]] = (JCOEF)(uVar11 << ((byte)cinfo->Al & 0x1f));
    }
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_AC_first(j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int tbl, sign, k;
  int v, m;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;   /* if error do nothing */

  /* There is always only one block per MCU */
  block = MCU_data[0];
  tbl = cinfo->cur_comp_info[0]->ac_tbl_no;

  /* Sections F.2.4.2 & F.1.4.4.2: Decoding of AC coefficients */

  /* Figure F.20: Decode_AC_coefficients */
  for (k = cinfo->Ss; k <= cinfo->Se; k++) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    if (arith_decode(cinfo, st)) break;         /* EOB flag */
    while (arith_decode(cinfo, st + 1) == 0) {
      st += 3;  k++;
      if (k > cinfo->Se) {
        WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
        entropy->ct = -1;                       /* spectral overflow */
        return TRUE;
      }
    }
    /* Figure F.21: Decoding nonzero value v */
    /* Figure F.22: Decoding the sign of v */
    sign = arith_decode(cinfo, entropy->fixed_bin);
    st += 2;
    /* Figure F.23: Decoding the magnitude category of v */
    if ((m = arith_decode(cinfo, st)) != 0) {
      if (arith_decode(cinfo, st)) {
        m <<= 1;
        st = entropy->ac_stats[tbl] +
             (k <= cinfo->arith_ac_K[tbl] ? 189 : 217);
        while (arith_decode(cinfo, st)) {
          if ((m <<= 1) == 0x8000) {
            WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
            entropy->ct = -1;                   /* magnitude overflow */
            return TRUE;
          }
          st += 1;
        }
      }
    }
    v = m;
    /* Figure F.24: Decoding the magnitude bit pattern of v */
    st += 14;
    while (m >>= 1)
      if (arith_decode(cinfo, st)) v |= m;
    v += 1;  if (sign) v = -v;
    /* Scale and output coefficient in natural (dezigzagged) order */
    (*block)[jpeg_natural_order[k]] = (JCOEF)((unsigned)v << cinfo->Al);
  }

  return TRUE;
}